

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__fancy_alpha_unweight_4ch(float *encode_buffer,int width_times_channels)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  float *pfVar7;
  float *input;
  float fVar8;
  
  pfVar1 = encode_buffer + width_times_channels;
  pfVar7 = encode_buffer + 4;
  do {
    fVar2 = pfVar7[-1];
    if (7.523164e-37 <= fVar2) {
      fVar8 = 1.0 / fVar2;
      fVar3 = pfVar7[1];
      fVar4 = pfVar7[2];
      fVar5 = pfVar7[3];
      *encode_buffer = *pfVar7 * fVar8;
      encode_buffer[1] = fVar3 * fVar8;
      encode_buffer[2] = fVar4 * fVar8;
      encode_buffer[3] = fVar5 * fVar8;
      encode_buffer[3] = fVar2;
    }
    else {
      uVar6 = *(undefined8 *)(pfVar7 + -2);
      *(undefined8 *)encode_buffer = *(undefined8 *)(pfVar7 + -4);
      *(undefined8 *)(encode_buffer + 2) = uVar6;
    }
    encode_buffer = encode_buffer + 4;
    pfVar7 = pfVar7 + 7;
  } while (encode_buffer < pfVar1);
  return;
}

Assistant:

static void stbir__fancy_alpha_unweight_4ch( float * encode_buffer, int width_times_channels )
{
  float STBIR_SIMD_STREAMOUT_PTR(*) encode = encode_buffer;
  float STBIR_SIMD_STREAMOUT_PTR(*) input = encode_buffer;
  float const * end_output = encode_buffer + width_times_channels;

  // fancy RGBA is stored internally as R G B A Rpm Gpm Bpm

  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float alpha = input[3];
#ifdef STBIR_SIMD
    stbir__simdf i,ia;
    STBIR_SIMD_NO_UNROLL(encode);
    if ( alpha < stbir__small_float )
    {
      stbir__simdf_load( i, input );
      stbir__simdf_store( encode, i );
    }
    else
    {
      stbir__simdf_load1frep4( ia, 1.0f / alpha );
      stbir__simdf_load( i, input+4 );
      stbir__simdf_mult( i, i, ia );
      stbir__simdf_store( encode, i );
      encode[3] = alpha;
    }
#else
    if ( alpha < stbir__small_float )
    {
      encode[0] = input[0];
      encode[1] = input[1];
      encode[2] = input[2];
    }
    else
    {
      float ialpha = 1.0f / alpha;
      encode[0] = input[4] * ialpha;
      encode[1] = input[5] * ialpha;
      encode[2] = input[6] * ialpha;
    }
    encode[3] = alpha;
#endif

    input += 7;
    encode += 4;
  } while ( encode < end_output );
}